

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O0

Boxed_Number __thiscall
chaiscript::Boxed_Number::assign_product(Boxed_Number *this,Boxed_Number *t_lhs,Boxed_Number *t_rhs)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Number BVar1;
  Boxed_Number local_30;
  Boxed_Number *local_20;
  Boxed_Number *t_rhs_local;
  Boxed_Number *t_lhs_local;
  
  local_20 = t_rhs;
  t_rhs_local = t_lhs;
  t_lhs_local = this;
  oper(&local_30,assign_product,&t_lhs->bv,&t_rhs->bv);
  Boxed_Number(this,&local_30.bv);
  Boxed_Value::~Boxed_Value(&local_30.bv);
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Boxed_Number)
         BVar1.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number assign_product(Boxed_Number t_lhs, const Boxed_Number &t_rhs) {
      return Boxed_Number(oper(Operators::Opers::assign_product, t_lhs.bv, t_rhs.bv));
    }